

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O3

double cert::cos(double __x)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  fVar4 = SUB84(__x,0) * SUB84(__x,0);
  fVar5 = 1.0;
  fVar6 = fVar4 * 0.5 + -1.0 + 1.0;
  uVar3 = -(uint)(-fVar6 <= fVar6);
  if (1.1920929e-07 < (float)(~uVar3 & (uint)-fVar6 | (uint)fVar6 & uVar3)) {
    fVar5 = 1.0;
    fVar7 = 2.0;
    iVar1 = 3;
    iVar2 = -1;
    fVar6 = fVar4;
    do {
      fVar8 = ((float)iVar2 * fVar6) / fVar7;
      iVar2 = -iVar2;
      fVar7 = fVar7 * (float)((iVar1 + 1) * iVar1);
      fVar5 = fVar5 + fVar8;
      fVar6 = fVar6 * fVar4;
      fVar8 = fVar5 - (((float)iVar2 * fVar6) / fVar7 + fVar5);
      iVar1 = iVar1 + 2;
      uVar3 = -(uint)(-fVar8 <= fVar8);
    } while (1.1920929e-07 < (float)(~uVar3 & (uint)-fVar8 | (uint)fVar8 & uVar3));
  }
  return (double)(ulong)(uint)fVar5;
}

Assistant:

constexpr float cos (float x)
{
	float sum = 1.0f;
	float n = 2.0f;
	int i = 3;
	int s = -1;
	float t = x * x;

	bool done = detail::feq (sum, sum + t * s / n);
	while (!done)
	{
		sum += t * s / n;
		n *= i * (i + 1);
		i += 2;
		s = -s;
		t *= x * x;
		done = detail::feq (sum, sum + t * s / n);
	}
	return sum;
	// return trig_series (x, 1.0f, 2.0f, 3, -1, x * x);
}